

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.cc
# Opt level: O2

void __thiscall EvalString::AddText(EvalString *this,StringPiece text)

{
  pointer ppVar1;
  string local_68;
  StringPiece local_48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>
  local_38;
  
  local_48.len_ = text.len_;
  local_48.str_ = text.str_;
  ppVar1 = (this->parsed_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((this->parsed_).
       super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
       ._M_impl.super__Vector_impl_data._M_start != ppVar1) && (ppVar1[-1].second == RAW)) {
    std::__cxx11::string::append((char *)(ppVar1 + -1),(ulong)local_48.str_);
    return;
  }
  StringPiece::AsString_abi_cxx11_(&local_68,&local_48);
  local_38.first._M_dataplus._M_p = (pointer)&local_38.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p == &local_68.field_2) {
    local_38.first.field_2._8_8_ = local_68.field_2._8_8_;
  }
  else {
    local_38.first._M_dataplus._M_p = local_68._M_dataplus._M_p;
  }
  local_38.first._M_string_length = local_68._M_string_length;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_38.second = RAW;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::
  vector<std::pair<std::__cxx11::string,EvalString::TokenType>,std::allocator<std::pair<std::__cxx11::string,EvalString::TokenType>>>
  ::emplace_back<std::pair<std::__cxx11::string,EvalString::TokenType>>
            ((vector<std::pair<std::__cxx11::string,EvalString::TokenType>,std::allocator<std::pair<std::__cxx11::string,EvalString::TokenType>>>
              *)this,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void EvalString::AddText(StringPiece text) {
  // Add it to the end of an existing RAW token if possible.
  if (!parsed_.empty() && parsed_.back().second == RAW) {
    parsed_.back().first.append(text.str_, text.len_);
  } else {
    parsed_.push_back(make_pair(text.AsString(), RAW));
  }
}